

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O3

string * __thiscall
libnbt::readString_abi_cxx11_
          (string *__return_storage_ptr__,libnbt *this,istream *in,int16_t length)

{
  string *in_RAX;
  ushort uVar1;
  uint uVar2;
  char ch;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar2 = (int)in + 1;
  while (uVar1 = (short)uVar2 - 1, uVar2 = (uint)uVar1, uVar1 != 0) {
    std::istream::get((char *)this);
    in_RAX = (string *)std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  return in_RAX;
}

Assistant:

static std::string readString(std::istream &in, int16_t length) {
        std::string temp;
        temp.clear();
        char ch;
        while (length--) {
            in.get(ch);
            temp.push_back(ch);
        }
        return temp;
    }